

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_50a29::DebugExpr::parse_non_term(DebugExpr *this,Context *param_1)

{
  Context *param_1_local;
  DebugExpr *this_local;
  
  std::function<void_()>::operator()(&this->fn);
  return true;
}

Assistant:

virtual bool parse_non_term(Context &) const
	{
		fn();
		return true;
	}